

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,sc_unsigned *u,long v)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  sc_length_param *psVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  sc_digit vd [3];
  
  iVar1 = u->sgn;
  if (v < 1) {
    bVar3 = 1;
    if (v == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = -1;
      v = -v;
      bVar3 = 0;
    }
  }
  else {
    iVar7 = 1;
    bVar3 = 0;
  }
  if ((bool)(iVar1 == 0 | bVar3)) {
    psVar4 = sc_context<sc_dt::sc_length_param>::default_value();
    sc_signed::sc_signed(__return_storage_ptr__,psVar4->m_len);
  }
  else {
    if (v == 0) {
      bVar8 = true;
      uVar6 = 0;
    }
    else {
      uVar5 = 0;
      do {
        vd[uVar5] = (uint)v & 0x3fffffff;
        uVar6 = uVar5 + 1;
        bVar8 = uVar5 < 2;
        if (!bVar8) break;
        bVar2 = 0x3fffffff < (ulong)v;
        uVar5 = uVar6;
        v = (ulong)v >> 0x1e;
      } while (bVar2);
    }
    if (bVar8) {
      memset(vd + (uVar6 & 0xffffffff),0,(ulong)(2 - (int)uVar6) * 4 + 4);
    }
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar7) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,0x40,3,vd);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(const sc_unsigned& u, long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}